

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O0

int q1_path(int srow,int scol,int y2,int x2)

{
  int iVar1;
  int iVar2;
  int dys;
  int dxs;
  int y;
  int x;
  int err;
  int k;
  int dy;
  int dx;
  int x2_local;
  int y2_local;
  int scol_local;
  int srow_local;
  
  iVar1 = x2 - scol;
  iVar2 = srow - y2;
  dys = srow;
  dxs = scol;
  if (iVar1 < iVar2) {
    y = -iVar2;
    x = iVar2;
    do {
      x = x + -1;
      y = iVar1 * 2 + y;
      if (x == 0) {
        return 1;
      }
      if (-1 < y) {
        dxs = dxs + 1;
        y = y + iVar2 * -2;
      }
      dys = dys + -1;
    } while (viz_clear_rows[dys][dxs] != '\0');
  }
  else {
    y = -iVar1;
    x = iVar1;
    do {
      x = x + -1;
      y = iVar2 * 2 + y;
      if (x == 0) {
        return 1;
      }
      if (-1 < y) {
        dys = dys + -1;
        y = y + iVar1 * -2;
      }
      dxs = dxs + 1;
    } while (viz_clear_rows[dys][dxs] != '\0');
  }
  return 0;
}

Assistant:

static int q1_path(int srow, int scol, int y2, int x2)
{
    int dx, dy;
    int k, err, x, y, dxs, dys;

    x  = scol;		y  = srow;
    dx = x2 - x;	dy = y - y2;

    dxs = dx << 1;	   /* save the shifted values */
    dys = dy << 1;
    if (dy > dx) {
	err = dxs - dy;

	for (k = dy-1; k; k--) {
	    if (err >= 0) {
		x++;
		err -= dys;
	    }
	    y--;
	    err += dxs;
	    if (!is_clear(y,x)) return 0; /* blocked */
	}
    } else {
	err = dys - dx;

	for (k = dx-1; k; k--) {
	    if (err >= 0) {
		y--;
		err -= dxs;
	    }
	    x++;
	    err += dys;
	    if (!is_clear(y,x)) return 0;/* blocked */
	}
    }

    return 1;
}